

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSwitchingDeviceType::IfcSwitchingDeviceType
          (IfcSwitchingDeviceType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcSwitchingDeviceType";
  Schema_2x3::IfcFlowControllerType::IfcFlowControllerType
            (&this->super_IfcFlowControllerType,&PTR_construction_vtable_24__00879488);
  *(undefined8 *)&(this->super_IfcFlowControllerType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x879308;
  *(undefined8 *)&this->field_0x1e0 = 0x879470;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x879330;
  (this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x879358;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x879380;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x8793a8;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x8793d0;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x8793f8;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x879420;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.field_0x1b0 = 0x879448;
  *(undefined1 **)&(this->super_IfcFlowControllerType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcSwitchingDeviceType() : Object("IfcSwitchingDeviceType") {}